

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAML.h
# Opt level: O0

int jaegertracing::utils::yaml::findOrDefault<int,char[10],int>
              (Node *node,char (*key) [10],int *defaultValue)

{
  bool bVar1;
  undefined1 local_48 [8];
  Node valueNode;
  int *defaultValue_local;
  char (*key_local) [10];
  Node *node_local;
  
  valueNode.m_pNode = (node *)defaultValue;
  YAML::Node::operator[]<char[10]>((Node *)local_48,node,key);
  bVar1 = YAML::Node::IsDefined((Node *)local_48);
  if (bVar1) {
    node_local._4_4_ = YAML::Node::as<int>((Node *)local_48);
  }
  else {
    node_local._4_4_ = *(int *)valueNode.m_pNode;
  }
  YAML::Node::~Node((Node *)local_48);
  return node_local._4_4_;
}

Assistant:

ValueType findOrDefault(const YAML::Node& node,
                        const KeyType& key,
                        const DefaultValueType& defaultValue)
{
    const auto valueNode = node[key];
    if (!valueNode.IsDefined()) {
        return defaultValue;
    }
    return valueNode.template as<ValueType>();
}